

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.h
# Opt level: O2

void __thiscall
kj::Canceler::AdapterImpl<capnp::Capability::Client>::cancel
          (AdapterImpl<capnp::Capability::Client> *this,Exception *e)

{
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_10;
  
  (**(this->fulfiller->super_PromiseRejector)._vptr_PromiseRejector)();
  local_10.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&this->inner,&local_10);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_10);
  return;
}

Assistant:

void cancel(Exception&& e) override {
      fulfiller.reject(kj::mv(e));
      inner = nullptr;
    }